

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void once_close_cb(uv_handle_t *handle)

{
  int iVar1;
  long *plVar2;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  long local_10;
  
  puts("ONCE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(handle);
    local_10 = (long)iVar1;
    if (local_10 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return;
    }
  }
  plVar2 = &local_10;
  once_close_cb_cold_1();
  pcVar3 = "REPEAT_CLOSE_CB";
  puts("REPEAT_CLOSE_CB");
  if (plVar2 != (long *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(pcVar3,0);
  return;
}

Assistant:

static void once_close_cb(uv_handle_t* handle) {
  printf("ONCE_CLOSE_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active(handle));

  once_close_cb_called++;
}